

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O0

void test_median_patch(GlobalArray *g_a,int *alo,int *ahi,GlobalArray *g_b,int *blo,int *bhi,
                      GlobalArray *g_c,int *clo,int *chi,GlobalArray *g_m,int *mlo,int *mhi)

{
  int iVar1;
  long lVar2;
  int *clo_00;
  GlobalArray *g_c_00;
  void *in_RDX;
  GlobalArray *in_RSI;
  float fVar3;
  double dVar4;
  char *in_stack_00000018;
  int *in_stack_00000020;
  GAServices *in_stack_00000028;
  GAServices *in_stack_00000030;
  int dims [7];
  int ndim;
  int type;
  int me;
  DoubleComplex dcval3;
  long lval3;
  float fval3;
  double dval3;
  int ival3;
  void *val3;
  DoubleComplex dcval2;
  long lval2;
  float fval2;
  double dval2;
  int ival2;
  void *val2;
  DoubleComplex dcval;
  long lval;
  float fval;
  double dval;
  int ival;
  void *val;
  DoubleComplex bdc;
  DoubleComplex adc;
  double bd;
  double ad;
  float bf;
  float af;
  long bl;
  long al;
  int bi;
  int ai;
  void *beta;
  void *alpha;
  DoubleComplex dcmax;
  DoubleComplex dcmin;
  double dmax;
  double dmin;
  long lmax;
  long lmin;
  float fmax;
  float fmin;
  int imax;
  int imin;
  void *max;
  void *min;
  int index [7];
  GlobalArray *g_e;
  int *in_stack_fffffffffffffd58;
  GAServices *in_stack_fffffffffffffd60;
  int *in_stack_fffffffffffffd68;
  GlobalArray *in_stack_fffffffffffffd70;
  GAServices *g_b_00;
  GAServices *this;
  GlobalArray *in_stack_fffffffffffffd88;
  GlobalArray *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  GlobalArray *in_stack_fffffffffffffda0;
  GlobalArray *in_stack_fffffffffffffda8;
  double local_250;
  int local_244;
  GlobalArray *in_stack_fffffffffffffdc0;
  int *in_stack_fffffffffffffdc8;
  int *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffdf8;
  int local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c4;
  undefined8 local_1c0;
  undefined4 local_1b4;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined4 local_18c;
  undefined8 local_188;
  undefined4 local_17c;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_154;
  undefined8 local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 *local_e8;
  undefined8 *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  float local_98;
  float local_94;
  int local_90;
  int local_8c;
  double *local_88;
  double *local_80;
  GlobalArray *local_58;
  void *local_38;
  GlobalArray *local_30;
  
  local_ec = 1;
  local_f0 = 0xffffffff;
  local_f8 = 1;
  local_100 = 0xffffffffffffffff;
  local_104 = 0x3f800000;
  local_108 = 0xbf800000;
  local_110 = 0x3ff0000000000000;
  local_118 = 0xbff0000000000000;
  local_128 = 0x3ff0000000000000;
  uStack_120 = 0;
  local_138 = 0xbff0000000000000;
  uStack_130 = 0;
  local_144 = 0xfffffffe;
  local_150 = 0xc000000000000000;
  local_154 = 0xc0000000;
  local_160 = 0xfffffffffffffffe;
  local_17c = 6;
  local_188 = 0x4018000000000000;
  local_18c = 0x40c00000;
  local_198 = 6;
  local_1b4 = 4;
  local_1c0 = 0x4010000000000000;
  local_1c4 = 0x40800000;
  local_1d0 = 4;
  local_38 = in_RDX;
  local_30 = in_RSI;
  iVar1 = GA_Nodeid();
  GA::GlobalArray::inquire
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  clo_00 = (int *)(ulong)(local_1e8 - 0x3e9);
  switch(clo_00) {
  case (int *)0x0:
    local_e0 = (undefined8 *)&local_ec;
    local_e8 = (undefined8 *)&local_f0;
    break;
  case (int *)0x1:
    local_e0 = &local_f8;
    local_e8 = &local_100;
    break;
  case (int *)0x2:
    local_e0 = (undefined8 *)&local_104;
    local_e8 = (undefined8 *)&local_108;
    break;
  case (int *)0x3:
    local_e0 = &local_110;
    local_e8 = &local_118;
    break;
  default:
    GA::GAServices::error(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,0);
    break;
  case (int *)0x6:
    local_e0 = &local_128;
    local_e8 = &local_138;
  }
  local_170 = 0xc000000000000000;
  local_168 = 0x8000000000000000;
  local_1a8 = 0x4018000000000000;
  local_1a0 = 0;
  local_1e0 = 0x4010000000000000;
  local_1d8 = 0;
  g_c_00 = (GlobalArray *)(ulong)(local_1e8 - 0x3e9);
  switch(g_c_00) {
  case (GlobalArray *)0x0:
    local_140 = (undefined8 *)&local_144;
    local_178 = (undefined8 *)&local_17c;
    local_1b0 = (undefined8 *)&local_1b4;
    break;
  case (GlobalArray *)0x1:
    local_140 = &local_160;
    local_178 = &local_198;
    local_1b0 = &local_1d0;
    break;
  case (GlobalArray *)0x2:
    local_140 = (undefined8 *)&local_154;
    local_178 = (undefined8 *)&local_18c;
    local_1b0 = (undefined8 *)&local_1c4;
    break;
  case (GlobalArray *)0x3:
    local_140 = &local_150;
    local_178 = &local_188;
    local_1b0 = &local_1c0;
    break;
  default:
    GA::GAServices::error(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,0);
    break;
  case (GlobalArray *)0x6:
    local_140 = &local_170;
    local_178 = &local_1a8;
    local_1b0 = &local_1e0;
  }
  if (iVar1 == 0) {
    printf("Testing GA_Median_patch...");
  }
  GA::GlobalArray::zero((GlobalArray *)0x105168);
  GA::GlobalArray::zero((GlobalArray *)0x105175);
  GA::GlobalArray::zero((GlobalArray *)0x105182);
  GA::GlobalArray::zero((GlobalArray *)0x10518f);
  GA::GlobalArray::fillPatch
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  GA::GlobalArray::fillPatch
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  GA::GlobalArray::fillPatch
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  g_b_00 = in_stack_00000028;
  this = in_stack_00000030;
  GA::GlobalArray::medianPatch
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             (int *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             &in_stack_fffffffffffffd90->mHandle,in_stack_fffffffffffffd88,(int *)in_stack_00000030,
             in_stack_fffffffffffffdd0,g_c_00,clo_00,in_stack_fffffffffffffde8,
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8);
  local_58 = GA::GAServices::createGA(this,(GlobalArray *)g_b_00,in_stack_00000018);
  GA::GlobalArray::zero((GlobalArray *)0x1052ad);
  GA::GlobalArray::addPatch
            (in_stack_fffffffffffffda0,
             (void *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->mHandle,(int *)this,local_38,
             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,
             &g_c_00->mHandle,clo_00);
  switch(local_1e8) {
  case 0x3e9:
    local_88 = (double *)&local_90;
    local_80 = (double *)&local_8c;
    break;
  case 0x3ea:
    local_88 = &local_a8;
    local_80 = &local_a0;
    break;
  case 0x3eb:
    local_88 = (double *)&local_98;
    local_80 = (double *)&local_94;
    break;
  case 0x3ec:
    local_88 = &local_b8;
    local_80 = &local_b0;
    break;
  default:
    GA_Error((char *)in_stack_00000028,(int)((ulong)in_stack_00000020 >> 0x20));
    break;
  case 0x3ef:
    local_88 = &local_d8;
    local_80 = &local_c8;
  }
  GA::GlobalArray::selectElem
            (local_30,(char *)in_stack_00000030,in_stack_00000028,in_stack_00000020);
  GA::GlobalArray::selectElem
            (local_30,(char *)in_stack_00000030,in_stack_00000028,in_stack_00000020);
  switch(local_1e8) {
  case 0x3e9:
    if (iVar1 == 0) {
      if (local_90 - local_8c < 0) {
        local_244 = -(local_90 - local_8c);
      }
      else {
        local_244 = local_90 - local_8c;
      }
      if (((1e-05 <= (double)local_244) || (local_90 != 0)) || (local_8c != 0)) {
        printf("not ok.\n");
        GA_Error((char *)in_stack_00000028,(int)((ulong)in_stack_00000020 >> 0x20));
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  case 0x3ea:
    if (iVar1 == 0) {
      if ((long)local_a8 - (long)local_a0 < 0) {
        lVar2 = -((long)local_a8 - (long)local_a0);
      }
      else {
        lVar2 = (long)local_a8 - (long)local_a0;
      }
      if (((1e-05 <= (double)lVar2) || (local_a8 != 0.0)) || (local_a0 != 0.0)) {
        printf("not ok.\n");
        GA_Error((char *)in_stack_00000028,(int)((ulong)in_stack_00000020 >> 0x20));
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  case 0x3eb:
    if (iVar1 == 0) {
      if (local_98 - local_94 < 0.0) {
        fVar3 = -(local_98 - local_94);
      }
      else {
        fVar3 = local_98 - local_94;
      }
      if (((1e-05 <= fVar3) || (local_98 != 0.0)) ||
         ((NAN(local_98) || ((local_94 != 0.0 || (NAN(local_94))))))) {
        printf("not ok.\n");
        GA_Error((char *)in_stack_00000028,(int)((ulong)in_stack_00000020 >> 0x20));
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  case 0x3ec:
    if (iVar1 == 0) {
      if (local_b8 - local_b0 < 0.0) {
        dVar4 = -(local_b8 - local_b0);
      }
      else {
        dVar4 = local_b8 - local_b0;
      }
      if ((((1e-05 <= dVar4) || (local_b8 != 0.0)) || (NAN(local_b8))) ||
         ((local_b0 != 0.0 || (NAN(local_b0))))) {
        printf("not ok.\n");
        GA_Error((char *)in_stack_00000028,(int)((ulong)in_stack_00000020 >> 0x20));
      }
      else {
        printf("ok.\n");
      }
    }
    break;
  default:
    GA::GAServices::error(in_stack_00000028,(char *)in_stack_00000020,0);
    break;
  case 0x3ef:
    if (iVar1 == 0) {
      if (local_d8 - local_c8 < 0.0) {
        local_250 = -(local_d8 - local_c8);
      }
      else {
        local_250 = local_d8 - local_c8;
      }
      if ((((local_250 < 1e-05) && (local_d8 == 0.0)) && (!NAN(local_d8))) &&
         ((local_c8 == 0.0 && (!NAN(local_c8))))) {
        if (local_d0 - local_c0 < 0.0) {
          dVar4 = -(local_d0 - local_c0);
        }
        else {
          dVar4 = local_d0 - local_c0;
        }
        if (((dVar4 < 1e-05) && (local_d0 == 0.0)) &&
           ((!NAN(local_d0) && ((local_c0 == 0.0 && (!NAN(local_c0))))))) {
          printf("ok.\n");
          return;
        }
      }
      printf("not ok.\n");
      GA_Error((char *)in_stack_00000028,(int)((ulong)in_stack_00000020 >> 0x20));
    }
  }
  return;
}

Assistant:

void 
test_median_patch (GA::GlobalArray * g_a, int *alo, int *ahi, 
		   GA::GlobalArray * g_b, int *blo, int *bhi,
		   GA::GlobalArray * g_c, int *clo, int *chi, 
		   GA::GlobalArray * g_m, int *mlo, int *mhi) {

  GA::GlobalArray * g_e;
  int index[MAXDIM];
  void *min, *max;
  int imin, imax;
  float fmin, fmax;
  long lmin, lmax;
  double dmin, dmax;
  DoubleComplex dcmin, dcmax;


  void *alpha, *beta;
  int ai = 1, bi = -1;
  long al = 1, bl = -1;
  float af = 1.0, bf = -1.0;
  double ad = 1.0, bd = -1.0;
  DoubleComplex adc = { 1.0, 0.0 };
  DoubleComplex bdc = {-1.0, 0.0 };

  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  void *val2;
  int ival2 = 6;
  double dval2 = 6.0;
  float fval2 = 6.0;
  long lval2 = 6;
  DoubleComplex dcval2;

  void *val3;
  int ival3 = 4;
  double dval3 = 4.0;
  float fval3 = 4.0;
  long lval3 = 4;
  DoubleComplex dcval3;

  int me = GA_Nodeid ();
  int type, ndim, dims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);


  switch (type)
    {
    case C_INT:
      alpha = (void *)&ai;
      beta =(void *) &bi;
      break;
    case C_DCPL:
      alpha =(void *) &adc;
      beta = (void *)&bdc;
      break;

    case C_DBL:
      alpha = (void *)&ad;
      beta = (void *)&bd;
      break;
    case C_FLOAT:
      alpha = (void *)&af;
      beta = (void *)&bf;
      break;
    case C_LONG:
      alpha = (void *)&al;
      beta = (void *)&bl;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }

  dcval.real = -2.0;
  dcval.imag = -0.0;

  dcval2.real = 6.0;
  dcval2.imag = 0.0;


  dcval3.real = 4.0;
  dcval3.imag = 0.0;


  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      val2 = (void *)&ival2;
      val3 = (void *)&ival3;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      val2 = (void *)&dcval2;
      val3 = (void *)&dcval3;
      break;
    case C_DBL:
      val = (void *)&dval;
      val2 = (void *)&dval2;
      val3 = (void *)&dval3;
      break;
    case C_FLOAT:
      val = (void *)&fval;
      val2 = (void *)&fval2;
      val3 = (void *)&fval3;
      break;
    case C_LONG:
      val = (void *)&lval;
      val2 = (void *)&lval2;
      val3 = (void *)&lval3;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:test_median:wrong data type.", 
			  type);
    }

  if (me == 0)
    printf ("Testing GA_Median_patch...");

  g_a->zero ();
  g_b->zero ();
  g_c->zero ();
  g_m->zero ();

  g_a->fillPatch (alo, ahi, val);
  g_b->fillPatch (blo, bhi, val2);
  g_c->fillPatch (alo, bhi, val3);

  g_m->medianPatch (g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, mlo, mhi);

  /*
    The result array should        be g_c due to the value I chose: 
    val3 is the median of the three values val, val2, and val3
  */

  /* g_e = g_c - g_m */
  g_e = GA::SERVICES.createGA(g_a, (char *)"E");
  g_e->zero ();
  g_e->addPatch (alpha, g_c, clo, chi, beta, g_m, mlo, mhi, alo, ahi);

  switch (type)
    {
    case C_INT:
      max = (void *)&imax;
      min = (void *)&imin;
      break;
    case C_DCPL:
      max = (void *)&dcmax;
      min = (void *)&dcmin;
      break;
    case C_DBL:
      max = (void *)&dmax;
      min = (void *)&dmin;
      break;
    case C_FLOAT:
      max = (void *)&fmax;
      min = (void *)&fmin;
      break;
    case C_LONG:
      max = (void *)&lmax;
      min = (void *)&lmin;
      break;
    default:
      GA_Error ((char *)"test_median:wrong data type.", type);
    }

  g_e->selectElem ((char *)"max", max, index);
  g_e->selectElem ((char *)"min", min, index);


  switch (type)
    {
      double r, m;
    case C_INT:
      if (me == 0)
	{
	  if (MISMATCHED (imax, imin) || (imax != 0) || (imin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DCPL:
      r = dcmax.real - dcmin.real;
      m = dcmax.imag - dcmin.imag;
      if (me == 0)
	{
	  if (MISMATCHED (dcmax.real, dcmin.real) || (dcmax.real != 0.0)
	      || (dcmin.real != 0.0) || MISMATCHED (dcmax.imag, dcmin.imag)
	      || (dcmax.imag != 0.0) || (dcmin.imag != 0.0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DBL:
      if (me == 0)
	{
	  if (MISMATCHED (dmax, dmin) || (dmax != 0) || (dmin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_FLOAT:
      if (me == 0)
	{
	  if (MISMATCHED (fmax, fmin) || (fmax != 0) || (fmin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_LONG:
      if (me == 0)
	{
	  if (MISMATCHED (lmax, lmin) || (lmax != 0) || (lmin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }


}